

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  byte bVar1;
  FieldDescriptor *field;
  char *pcVar2;
  double dVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int iVar6;
  Descriptor *v1;
  Reflection *this;
  Reflection *this_00;
  LogMessageData *pLVar7;
  MessageFactory *pMVar8;
  MessageFactory *pMVar9;
  MapFieldBase *this_01;
  MapFieldBase *this_02;
  Message *pMVar10;
  uint64_t uVar11;
  EnumValueDescriptor *pEVar12;
  int64_t iVar13;
  MessageFactory *pMVar14;
  Message *pMVar15;
  SooRep *this_03;
  UnknownFieldSet *this_04;
  UnknownFieldSet *other;
  Nonnull<const_char_*> pcVar16;
  Descriptor *extraout_RAX;
  LogMessage *pLVar17;
  bool bVar18;
  int index;
  Descriptor *unaff_RBX;
  bool bVar19;
  float fVar20;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view v_00;
  Metadata MVar21;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  LogMessageData *local_90;
  LogMessageData *local_88;
  string local_80;
  string local_60;
  LogMessageFatal local_40;
  
  if (from == to) {
    Merge();
    v1 = extraout_RAX;
  }
  else {
    MVar21 = Message::GetMetadata(from);
    unaff_RBX = MVar21.descriptor;
    MVar21 = Message::GetMetadata(to);
    v1 = MVar21.descriptor;
    if (v1 == unaff_RBX) {
      this = GetReflectionOrDie(from);
      this_00 = GetReflectionOrDie(to);
      local_90 = (LogMessageData *)Reflection::GetMessageFactory(this);
      pLVar7 = (LogMessageData *)MessageFactory::generated_factory();
      pMVar8 = Reflection::GetMessageFactory(this_00);
      pMVar9 = MessageFactory::generated_factory();
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Reflection::ListFields(this,from,&local_a8);
      local_88 = (LogMessageData *)
                 local_a8.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar19 = local_90 == pLVar7;
        pLVar7 = (LogMessageData *)
                 local_a8.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          field = (FieldDescriptor *)(pLVar7->entry).full_filename_._M_len;
          bVar1 = field->field_0x1;
          bVar18 = (bool)((bVar1 & 0x20) >> 5);
          local_90 = pLVar7;
          if (0xbf < bVar1 != bVar18) {
            pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar18,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar16);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
          }
          if ((bVar1 & 0x20) == 0) {
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
            case 1:
              iVar4 = Reflection::GetInt32(this,from,field);
              Reflection::SetInt32(this_00,to,field,iVar4);
              break;
            case 2:
              iVar13 = Reflection::GetInt64(this,from,field);
              Reflection::SetInt64(this_00,to,field,iVar13);
              break;
            case 3:
              uVar5 = Reflection::GetUInt32(this,from,field);
              Reflection::SetUInt32(this_00,to,field,uVar5);
              break;
            case 4:
              uVar11 = Reflection::GetUInt64(this,from,field);
              Reflection::SetUInt64(this_00,to,field,uVar11);
              break;
            case 5:
              dVar3 = Reflection::GetDouble(this,from,field);
              Reflection::SetDouble(this_00,to,field,dVar3);
              break;
            case 6:
              fVar20 = Reflection::GetFloat(this,from,field);
              Reflection::SetFloat(this_00,to,field,fVar20);
              break;
            case 7:
              bVar18 = Reflection::GetBool(this,from,field);
              Reflection::SetBool(this_00,to,field,bVar18);
              break;
            case 8:
              pEVar12 = Reflection::GetEnum(this,from,field);
              Reflection::SetEnum(this_00,to,field,pEVar12);
              break;
            case 9:
              Reflection::GetString_abi_cxx11_(&local_80,this,from,field);
              Reflection::SetString(this_00,to,field,&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            case 10:
              pMVar10 = Reflection::GetMessage(this,from,field,(MessageFactory *)0x0);
              if (this == this_00) {
                MVar21 = Message::GetMetadata(pMVar10);
                pMVar14 = Reflection::GetMessageFactory(MVar21.reflection);
              }
              else {
                pMVar14 = (MessageFactory *)0x0;
              }
              pMVar15 = Reflection::MutableMessage(this_00,to,field,pMVar14);
              Message::MergeFrom(pMVar15,pMVar10);
            }
          }
          else {
            if ((((pMVar8 != pMVar9) != bVar19) && (field->type_ == '\v')) &&
               (bVar18 = FieldDescriptor::is_map_message_type(field), bVar18)) {
              this_01 = Reflection::GetMapData(this,from,field);
              this_02 = Reflection::MutableMapData(this_00,to,field);
              bVar18 = MapFieldBase::IsMapValid(this_02);
              if ((bVar18) && (bVar18 = MapFieldBase::IsMapValid(this_01), bVar18)) {
                MapFieldBase::MergeFrom(this_02,this_01);
                goto switchD_00faa333_default;
              }
            }
            iVar6 = Reflection::FieldSize(this,from,field);
            if (0 < iVar6) {
              index = 0;
              do {
                switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)
                      ) {
                case 1:
                  iVar4 = Reflection::GetRepeatedInt32(this,from,field,index);
                  Reflection::AddInt32(this_00,to,field,iVar4);
                  break;
                case 2:
                  iVar13 = Reflection::GetRepeatedInt64(this,from,field,index);
                  Reflection::AddInt64(this_00,to,field,iVar13);
                  break;
                case 3:
                  uVar5 = Reflection::GetRepeatedUInt32(this,from,field,index);
                  Reflection::AddUInt32(this_00,to,field,uVar5);
                  break;
                case 4:
                  uVar11 = Reflection::GetRepeatedUInt64(this,from,field,index);
                  Reflection::AddUInt64(this_00,to,field,uVar11);
                  break;
                case 5:
                  dVar3 = Reflection::GetRepeatedDouble(this,from,field,index);
                  Reflection::AddDouble(this_00,to,field,dVar3);
                  break;
                case 6:
                  fVar20 = Reflection::GetRepeatedFloat(this,from,field,index);
                  Reflection::AddFloat(this_00,to,field,fVar20);
                  break;
                case 7:
                  bVar18 = Reflection::GetRepeatedBool(this,from,field,index);
                  Reflection::AddBool(this_00,to,field,bVar18);
                  break;
                case 8:
                  pEVar12 = Reflection::GetRepeatedEnum(this,from,field,index);
                  Reflection::AddEnum(this_00,to,field,pEVar12);
                  break;
                case 9:
                  Reflection::GetRepeatedString_abi_cxx11_(&local_60,this,from,field,index);
                  Reflection::AddString(this_00,to,field,&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    local_60.field_2._M_allocated_capacity + 1);
                  }
                  break;
                case 10:
                  pMVar10 = Reflection::GetRepeatedMessage(this,from,field,index);
                  if (this == this_00) {
                    MVar21 = Message::GetMetadata(pMVar10);
                    pMVar14 = Reflection::GetMessageFactory(MVar21.reflection);
                  }
                  else {
                    pMVar14 = (MessageFactory *)0x0;
                  }
                  pMVar15 = Reflection::AddMessage(this_00,to,field,pMVar14);
                  Message::MergeFrom(pMVar15,pMVar10);
                }
                index = index + 1;
              } while (iVar6 != index);
            }
          }
switchD_00faa333_default:
          pLVar7 = (LogMessageData *)&(local_90->entry).full_filename_._M_str;
        } while (pLVar7 != local_88);
      }
      this_03 = (SooRep *)Reflection::GetUnknownFields(this,from);
      iVar6 = SooRep::size(this_03,(undefined1  [16])
                                   ((undefined1  [16])this_03->field_0 & (undefined1  [16])0x4) ==
                                   (undefined1  [16])0x0);
      if (iVar6 != 0) {
        this_04 = Reflection::MutableUnknownFields(this_00,to);
        other = Reflection::GetUnknownFields(this,from);
        UnknownFieldSet::MergeFrom(this_04,other);
      }
      if ((LogMessageData *)
          local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (LogMessageData *)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                      (v1,unaff_RBX,"to->GetDescriptor() == descriptor");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
             ,0x36,pcVar16);
  str._M_str = "Tried to merge messages of different types ";
  str._M_len = 0x2b;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)&local_a8,str);
  str_00._M_str = "(merge ";
  str_00._M_len = 7;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)&local_a8,str_00);
  pcVar2 = (unaff_RBX->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
  v._M_str = pcVar2 + ~v._M_len;
  pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_a8,v);
  str_01._M_str = " to ";
  str_01._M_len = 4;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar17,str_01);
  MVar21 = Message::GetMetadata(to);
  pcVar2 = ((MVar21.descriptor)->all_names_).payload_;
  v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
  v_00._M_str = pcVar2 + ~v_00._M_len;
  pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar17,v_00);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar17,(char (*) [2])0x11d60e1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a8);
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  ABSL_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  ABSL_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            const Message& from_child =
                from_reflection->GetRepeatedMessage(from, field, j);
            if (from_reflection == to_reflection) {
              to_reflection
                  ->AddMessage(to, field,
                               from_child.GetReflection()->GetMessageFactory())
                  ->MergeFrom(from_child);
            } else {
              to_reflection->AddMessage(to, field)->MergeFrom(from_child);
            }
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          const Message& from_child = from_reflection->GetMessage(from, field);
          if (from_reflection == to_reflection) {
            to_reflection
                ->MutableMessage(
                    to, field, from_child.GetReflection()->GetMessageFactory())
                ->MergeFrom(from_child);
          } else {
            to_reflection->MutableMessage(to, field)->MergeFrom(from_child);
          }
          break;
      }
    }
  }

  if (!from_reflection->GetUnknownFields(from).empty()) {
    to_reflection->MutableUnknownFields(to)->MergeFrom(
        from_reflection->GetUnknownFields(from));
  }
}